

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

int __thiscall libDAI::NDP::init(NDP *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 uVar2;
  ostream *this_00;
  void *this_01;
  string *in_stack_00000020;
  size_t in_stack_00000028;
  Exception *in_stack_00000030;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  uVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    Exception::Exception(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  if ((this->Props).verbose != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"NDP initialized at verbose=");
    this_01 = (void *)std::ostream::operator<<(this_00,(this->Props).verbose);
    this = (NDP *)std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return (int)this;
}

Assistant:

void NDP::init() { //messages (one for each edge?) are initialized with uniform probabilities
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);
        /*
        for( vector<Prob>::iterator mij = _messages.begin(); mij != _messages.end(); mij++ )
            //mij->fill(1.0 / mij->size());
            //mij->fill(0.0 ); //FRANS Max-plus initialized on 0.0
            mij->fill( (double) rand() * 50 / RAND_MAX ); //FRANS Max-plus initialized on 0.0
        _newmessages = _messages;
        */
        if( Props.verbose >= 1)
            cout << "NDP initialized at verbose="<<Props.verbose<<endl;
    }